

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_thread.cpp
# Opt level: O2

void __thiscall DrawerCommandQueue::StopThreads(DrawerCommandQueue *this)

{
  pointer pDVar1;
  DrawerThread *thread;
  pointer pDVar2;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_30;
  
  std::unique_lock<std::mutex>::unique_lock(&local_30,&this->start_mutex);
  this->shutdown_flag = true;
  std::unique_lock<std::mutex>::unlock(&local_30);
  std::condition_variable::notify_all();
  pDVar1 = (this->threads).super__Vector_base<DrawerThread,_std::allocator<DrawerThread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pDVar2 = (this->threads).super__Vector_base<DrawerThread,_std::allocator<DrawerThread>_>.
                _M_impl.super__Vector_impl_data._M_start; pDVar2 != pDVar1; pDVar2 = pDVar2 + 1) {
    std::thread::join();
  }
  std::vector<DrawerThread,_std::allocator<DrawerThread>_>::clear(&this->threads);
  std::unique_lock<std::mutex>::lock(&local_30);
  this->shutdown_flag = false;
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return;
}

Assistant:

void DrawerCommandQueue::StopThreads()
{
	std::unique_lock<std::mutex> lock(start_mutex);
	shutdown_flag = true;
	lock.unlock();
	start_condition.notify_all();
	for (auto &thread : threads)
		thread.thread.join();
	threads.clear();
	lock.lock();
	shutdown_flag = false;
}